

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O2

void living_blade_pulse(OBJ_DATA *obj,OBJ_AFFECT_DATA *af)

{
  CHAR_DATA *ch;
  bool bVar1;
  short sVar2;
  int iVar3;
  char *pcVar4;
  OBJ_AFFECT_DATA *pOVar5;
  short sVar6;
  char *pcVar7;
  char *pcVar8;
  CHAR_DATA *ch_00;
  char buf [4608];
  
  ch = obj->carried_by;
  if (ch == (CHAR_DATA *)0x0) {
    return;
  }
  if (ch != af->owner) {
    iVar3 = number_percent();
    if (6 < iVar3) {
      return;
    }
    if (af->location != 0x13) {
      return;
    }
    iVar3 = number_range(1,3);
    if (iVar3 == 3) {
      pcVar8 = "$p whispers menacingly: \'My master will devour your soul, blasphemer.\'";
    }
    else if (iVar3 == 2) {
      pcVar8 = "$p writhes in your grasp as you hear a faint cry of outrage.";
    }
    else {
      if (iVar3 != 1) {
        return;
      }
      pcVar8 = "$p hisses at you: \'Insignificant whelp, you are unworthy of my power!\'";
    }
    act(pcVar8,ch,obj,(void *)0x0,3);
    return;
  }
  ch_00 = ch->fighting;
  if (ch_00 != (CHAR_DATA *)0x0) goto LAB_0038049a;
  if (((af->modifier != 0) || (iVar3 = number_percent(), 3 < iVar3)) || (af->location != 0x13))
  goto LAB_0038048d;
  iVar3 = number_range(1,4);
  switch(iVar3) {
  case 1:
    pcVar7 = get_char_color(ch,"red");
    pcVar8 = ch->name;
    pcVar4 = END_COLOR(ch);
    sprintf(buf,"%sBlood... give me blood, %s, lest I feast upon thine....%s\n\r",pcVar7,pcVar8,
            pcVar4);
    goto switchD_0038037f_default;
  case 2:
    pcVar8 = get_char_color(ch,"red");
    END_COLOR(ch);
    pcVar7 = "%sBaal will be most displeased to learn of your timidity....%s\n\r";
    break;
  case 3:
    pcVar8 = get_char_color(ch,"red");
    END_COLOR(ch);
    pcVar7 = "%sI was meant to be wielded by hands more powerful than thine, mortal.%s\n\r";
    break;
  case 4:
    pcVar8 = get_char_color(ch,"red");
    END_COLOR(ch);
    pcVar7 = "%sFool!  Wield me in battle and I will make thee as a god!%s\n\r";
    break;
  default:
    goto switchD_0038037f_default;
  }
  sprintf(buf,pcVar7,pcVar8);
switchD_0038037f_default:
  act("$p twists in your grasp, hissing caustically:",ch,obj,(void *)0x0,3);
  send_to_char(buf,ch);
LAB_0038048d:
  ch_00 = ch->fighting;
  if (ch_00 == (CHAR_DATA *)0x0) {
    iVar3 = number_percent();
    if (iVar3 < 0x22) {
      pOVar5 = new_affect_obj();
      pOVar5->where = af->where;
      pOVar5->aftype = af->aftype;
      pOVar5->type = af->type;
      pOVar5->owner = af->owner;
      pOVar5->level = af->level;
      pOVar5->location = af->location;
      pOVar5->modifier = af->modifier;
      pOVar5->duration = af->duration;
      pOVar5->end_fun = af->end_fun;
      pOVar5->pulse_fun = af->pulse_fun;
      affect_remove_obj(obj,af,false);
      sVar2 = (short)*(undefined4 *)&pOVar5->modifier + -1;
      if (sVar2 < 1) {
        sVar2 = 0;
      }
      pOVar5->modifier = sVar2;
      affect_to_obj(obj,pOVar5);
      return;
    }
    ch_00 = ch->fighting;
    if (ch_00 == (CHAR_DATA *)0x0) {
      return;
    }
  }
LAB_0038049a:
  if (((ushort)(obj->wear_loc | 2U) == 0x12) &&
     ((bVar1 = is_npc(ch_00), !bVar1 || (iVar3 = number_percent(), iVar3 < 6)))) {
    pOVar5 = new_affect_obj();
    pOVar5->where = af->where;
    pOVar5->aftype = af->aftype;
    pOVar5->type = af->type;
    pOVar5->owner = af->owner;
    pOVar5->level = af->level;
    pOVar5->location = af->location;
    pOVar5->modifier = af->modifier;
    pOVar5->duration = af->duration;
    pOVar5->end_fun = af->end_fun;
    pOVar5->pulse_fun = af->pulse_fun;
    affect_remove_obj(obj,af,false);
    bVar1 = is_npc(ch->fighting);
    if ((bVar1) && (sVar2 = pOVar5->modifier, sVar2 < 0x10)) {
      sVar6 = 0xe;
      if (sVar2 < 0xe) {
        sVar6 = sVar2;
      }
      sVar2 = sVar6 + 1;
    }
    else {
      bVar1 = is_npc(ch->fighting);
      if (bVar1) {
        sVar2 = pOVar5->modifier + -2;
      }
      else {
        sVar6 = pOVar5->modifier + 1;
        sVar2 = 0x32;
        if (sVar6 < 0x32) {
          sVar2 = sVar6;
        }
      }
    }
    pOVar5->modifier = sVar2;
    affect_to_obj(obj,pOVar5);
    iVar3 = number_percent();
    if ((iVar3 < 10) && (pOVar5->location == 0x13)) {
      iVar3 = number_range(1,3);
      if (iVar3 == 3) {
        pcVar8 = "$p cries with glee: \'Yes!  Yes!  Tear their heart out!\'";
      }
      else if (iVar3 == 2) {
        pcVar8 = "$p writhes as you faintly hear sounds not unlike cries of carnal ecstasy.";
      }
      else {
        if (iVar3 != 1) {
          return;
        }
        pcVar8 = "A hollow laughter reaches your ears as $p pulses in your grasp.";
      }
      act(pcVar8,ch,obj,(void *)0x0,3);
    }
  }
  return;
}

Assistant:

void living_blade_pulse(OBJ_DATA *obj, OBJ_AFFECT_DATA *af)
{
	char buf[MSL];
	CHAR_DATA *ch;
	OBJ_AFFECT_DATA *af2;

	if ((ch = obj->carried_by) == nullptr)
		return;

	if (ch != af->owner)
	{
		if (number_percent() < 7 && af->location == APPLY_DAMROLL)
		{
			switch (number_range(1, 3))
			{
				case 1:
					act("$p hisses at you: 'Insignificant whelp, you are unworthy of my power!'", ch, obj, 0, TO_CHAR);
					break;
				case 2:
					act("$p writhes in your grasp as you hear a faint cry of outrage.", ch, obj, 0, TO_CHAR);
					break;
				case 3:
					act("$p whispers menacingly: 'My master will devour your soul, blasphemer.'", ch, obj, 0, TO_CHAR);
					break;
			}
		}

		return;
	}

	if (!ch->fighting && af->modifier == 0)
	{
		if (number_percent() < 4 && af->location == APPLY_DAMROLL)
		{
			switch (number_range(1, 4))
			{
				case 1:
					sprintf(buf, "%sBlood... give me blood, %s, lest I feast upon thine....%s\n\r",
						get_char_color(ch, "red"),
						ch->name,
						END_COLOR(ch));
					break;
				case 2:
					sprintf(buf, "%sBaal will be most displeased to learn of your timidity....%s\n\r",
						get_char_color(ch, "red"),
						END_COLOR(ch));
					break;
				case 3:
					sprintf(buf, "%sI was meant to be wielded by hands more powerful than thine, mortal.%s\n\r",
						get_char_color(ch, "red"),
						END_COLOR(ch));
					break;
				case 4:
					sprintf(buf, "%sFool!  Wield me in battle and I will make thee as a god!%s\n\r",
						get_char_color(ch, "red"),
						END_COLOR(ch));
					break;
			}

			act("$p twists in your grasp, hissing caustically:", ch, obj, 0, TO_CHAR);
			send_to_char(buf, ch);
		}
	}

	if (!ch->fighting && number_percent() <= 33)
	{
		af2 = new_affect_obj();
		af2->where = af->where;
		af2->aftype = af->aftype;
		af2->type = af->type;
		af2->owner = af->owner;
		af2->level = af->level;
		af2->location = af->location;
		af2->modifier = af->modifier;
		af2->duration = af->duration;
		af2->end_fun = af->end_fun;
		af2->pulse_fun = af->pulse_fun;
		affect_remove_obj(obj, af, false);

		af2->modifier--;
		af2->modifier = std::max(0, (int)af2->modifier);
		affect_to_obj(obj, af2);

		return;
	}
	else if (!ch->fighting)
	{
		return;
	}

	if (!(obj->wear_loc == WEAR_WIELD || obj->wear_loc == WEAR_DUAL_WIELD))
		return;

	if (is_npc(ch->fighting) && number_percent() > 5)
		return;

	af2 = new_affect_obj();
	af2->where = af->where;
	af2->aftype = af->aftype;
	af2->type = af->type;
	af2->owner = af->owner;
	af2->level = af->level;
	af2->location = af->location;
	af2->modifier = af->modifier;
	af2->duration = af->duration;
	af2->end_fun = af->end_fun;
	af2->pulse_fun = af->pulse_fun;
	affect_remove_obj(obj, af, false);

	if (is_npc(ch->fighting) && af2->modifier <= 15)
	{
		af2->modifier++;
		af2->modifier = std::min((int)af2->modifier, 15);
	}
	else if (is_npc(ch->fighting))
	{
		af2->modifier -= 2;
	}
	else
	{
		af2->modifier++;
		af2->modifier = std::min((int)af2->modifier, 50);
	}

	affect_to_obj(obj, af2);

	if (number_percent() < 10 && af2->location == APPLY_DAMROLL)
	{
		switch (number_range(1, 3))
		{
			case 1:
				act("A hollow laughter reaches your ears as $p pulses in your grasp.", ch, obj, 0, TO_CHAR);
				break;
			case 2:
				act("$p writhes as you faintly hear sounds not unlike cries of carnal ecstasy.", ch, obj, 0, TO_CHAR);
				break;
			case 3:
				act("$p cries with glee: 'Yes!  Yes!  Tear their heart out!'", ch, obj, 0, TO_CHAR);
				break;
		}
	}
}